

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O2

void Acec_ManPool(Gia_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  Vec_Int_t *vAdds;
  abctime aVar3;
  Vec_Int_t *vRootBoxes;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar4;
  abctime time;
  abctime time_00;
  char *pcVar5;
  int i;
  
  aVar2 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds);
  pcVar5 = (char *)(ulong)uVar1;
  printf("Detected %d FAs and %d HAs.  ",pcVar5,(ulong)(vAdds->nSize / 6 - uVar1));
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar2,pcVar5,time);
  aVar2 = Abc_Clock();
  uVar1 = Ree_ManCountFadds(vAdds);
  pcVar5 = (char *)(ulong)uVar1;
  printf("Detected %d FAs and %d HAs.  ",pcVar5,(ulong)(vAdds->nSize / 6 - uVar1));
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar2,pcVar5,time_00);
  vRootBoxes = Acec_ManPoolTopMost(p,vAdds);
  pcVar5 = "";
  if (1 < vRootBoxes->nSize) {
    pcVar5 = "s";
  }
  printf("Detected %d topmost adder%s.\n",(ulong)(uint)vRootBoxes->nSize,pcVar5);
  p_00 = Gia_PolynCoreOrderArray(p,vAdds,vRootBoxes);
  for (i = 0; i < p_00->nSize; i = i + 1) {
    pVVar4 = Vec_WecEntry(p_00,i);
    uVar1 = Vec_IntEntry(vRootBoxes,i);
    printf("Adder %5d : Tree with %5d nodes.\n",(ulong)uVar1,(ulong)(uint)pVVar4->nSize);
  }
  Vec_WecFree(p_00);
  Vec_IntFree(vAdds);
  Vec_IntFree(vRootBoxes);
  return;
}

Assistant:

void Acec_ManPool( Gia_Man_t * p )
{
    Vec_Int_t * vTops, * vTree;
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    //Ree_ManPrintAdders( vAdds, 1 );

    // detect topmost nodes
    vTops = Acec_ManPoolTopMost( p, vAdds );
    printf( "Detected %d topmost adder%s.\n", Vec_IntSize(vTops), Vec_IntSize(vTops) > 1 ? "s":"" );

    // collect adder trees
    vTrees = Gia_PolynCoreOrderArray( p, vAdds, vTops );
    Vec_WecForEachLevel( vTrees, vTree, i )
        printf( "Adder %5d : Tree with %5d nodes.\n", Vec_IntEntry(vTops, i), Vec_IntSize(vTree) );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
    Vec_IntFree( vTops );
}